

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O1

void __thiscall aalcalc::loadperiodtoweighting(aalcalc *this)

{
  FILE *__stream;
  size_t sVar1;
  mapped_type *pmVar2;
  float fVar3;
  Periods p;
  key_type local_24;
  double local_20;
  
  __stream = fopen("input/periods.bin","rb");
  if (__stream != (FILE *)0x0) {
    sVar1 = fread(&local_24,0xc,1,__stream);
    if (sVar1 != 0) {
      do {
        fVar3 = (float)local_20;
        pmVar2 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[](&this->periodstoweighting_,&local_24);
        *pmVar2 = (double)fVar3;
        sVar1 = fread(&local_24,0xc,1,__stream);
      } while (sVar1 != 0);
    }
  }
  return;
}

Assistant:

void aalcalc::loadperiodtoweighting()
{
	FILE *fin = fopen(PERIODS_FILE, "rb");
	if (fin == NULL) return;

	Periods p;
	size_t i = fread(&p, sizeof(Periods), 1, fin);
	while (i != 0) {
		periodstoweighting_[p.period_no] = (OASIS_FLOAT)p.weighting;		
		i = fread(&p, sizeof(Periods), 1, fin);
	}

}